

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O2

Float __thiscall pbrt::FloatPtexTexture::Evaluate(FloatPtexTexture *this,TextureEvalContext ctx)

{
  int iVar1;
  float local_14;
  float local_10;
  float local_c;
  
  iVar1 = PtexTextureBase::SampleTexture(&this->super_PtexTextureBase,ctx,&local_14);
  if (iVar1 != 1) {
    local_14 = (local_14 + local_10 + local_c) / 3.0;
  }
  return local_14;
}

Assistant:

Float FloatPtexTexture::Evaluate(TextureEvalContext ctx) const {
#ifdef PBRT_IS_GPU_CODE
    LOG_FATAL("Ptex not supported with GPU renderer");
    return 0;
#else
    float result[3];
    int nc = SampleTexture(ctx, result);
    if (nc == 1)
        return result[0];
    DCHECK_EQ(3, nc);
    return (result[0] + result[1] + result[2]) / 3;
#endif
}